

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O2

gc_table * __thiscall
mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
          (gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *this)

{
  slot *psVar1;
  allocation_context *this_00;
  
  this_00 = &this->heap_->alloc_context_;
  psVar1 = gc_heap::allocation_context::get_at(this_00,(this->table_).pos_ - 1);
  if (gc_type_info_registration<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table>
      ::reg._40_4_ == (psVar1->allocation).type) {
    psVar1 = gc_heap::allocation_context::get_at(this_00,(this->table_).pos_);
    return (gc_table *)psVar1;
  }
  __assert_fail("h.type_check<T>(pos_)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1db,
                "T &mjs::gc_heap_ptr_untracked<mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table>::dereference(gc_heap &) const [T = mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table, strong = true]"
               );
}

Assistant:

gc_table& tab() const { return table_.dereference(heap_); }